

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<BGIP_BnB_Node> * __thiscall
boost::shared_ptr<BGIP_BnB_Node>::operator=
          (shared_ptr<BGIP_BnB_Node> *this,shared_ptr<BGIP_BnB_Node> *r)

{
  shared_ptr<BGIP_BnB_Node> *in_RDI;
  shared_ptr<BGIP_BnB_Node> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<BGIP_BnB_Node> *)0x15c6de);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }